

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptor::DebugString
          (OneofDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  long lVar1;
  string prefix;
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
             prefix._M_dataplus._M_p +
             CONCAT44(prefix._M_string_length._4_4_,(int)prefix._M_string_length));
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  local_60.text_ = prefix._M_dataplus._M_p;
  local_60.size_ = (int)prefix._M_string_length;
  local_90.text_ = (char *)**(undefined8 **)this;
  local_90.size_ = *(int *)(*(undefined8 **)this + 1);
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_210.size_ = -1;
  local_120.text_ = (char *)0x0;
  local_120.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0oneof $1 {",&local_60,&local_90,&local_c0,&local_f0,&local_1e0,&local_210,
             &local_120,&local_150,&local_180,&local_1b0);
  anon_unknown_1::FormatLineOptions
            (depth + 1,*(Message **)(this + 0x28),
             *(DescriptorPool **)(*(long *)(*(long *)(this + 0x10) + 0x10) + 0x10),contents);
  if (debug_string_options->elide_oneof_body == true) {
    std::__cxx11::string::append((char *)contents);
  }
  else {
    std::__cxx11::string::append((char *)contents);
    if (0 < *(int *)(this + 0x18)) {
      lVar1 = 0;
      do {
        FieldDescriptor::DebugString
                  (*(FieldDescriptor **)(*(long *)(this + 0x20) + lVar1 * 8),depth + 1,OMIT_LABEL,
                   contents,debug_string_options);
        lVar1 = lVar1 + 1;
      } while (lVar1 < *(int *)(this + 0x18));
    }
    local_60.text_ = prefix._M_dataplus._M_p;
    local_60.size_ = (int)prefix._M_string_length;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_60,&local_90,&local_c0,&local_f0,&local_1e0,&local_210,
               &local_120,&local_150,&local_180,&local_1b0);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OneofDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;
  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);
  strings::SubstituteAndAppend(contents, "$0oneof $1 {", prefix, name());

  FormatLineOptions(depth, options(), containing_type()->file()->pool(),
                    contents);

  if (debug_string_options.elide_oneof_body) {
    contents->append(" ... }\n");
  } else {
    contents->append("\n");
    for (int i = 0; i < field_count(); i++) {
      field(i)->DebugString(depth, FieldDescriptor::OMIT_LABEL, contents,
                            debug_string_options);
    }
    strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  }
  comment_printer.AddPostComment(contents);
}